

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

int __thiscall CPU::instrASL0x1e(CPU *this)

{
  uint8_t argument;
  CPU *in_RDI;
  Memory *unaff_retaddr;
  uint16_t address;
  CPU *pCVar1;
  
  pCVar1 = in_RDI;
  absolute_x_addr_j(in_RDI);
  argument = Memory::Read8(in_RDI->m,(uint16_t)((ulong)in_RDI >> 0x30));
  ASL(in_RDI,argument);
  Memory::Write8(unaff_retaddr,(uint16_t)((ulong)pCVar1 >> 0x30),(uint8_t)((ulong)pCVar1 >> 0x28));
  return 7;
}

Assistant:

int CPU::instrASL0x1e() {
	uint16_t address = absolute_x_addr_j();
	m->Write8(address, ASL(m->Read8(address)));
	return 7;
}